

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int CVmObjString::getp_substr(vm_val_t *retval,vm_val_t *self_val,char *str,uint *in_argc)

{
  ulong uVar1;
  int iVar2;
  int32_t iVar3;
  vm_obj_id_t obj_00;
  char *pcVar4;
  uint *in_RCX;
  long in_RDX;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  bool bVar5;
  uint argc;
  vm_obj_id_t obj;
  size_t new_len;
  size_t start_rem;
  utf8_ptr start_p;
  utf8_ptr p;
  size_t rem;
  long len;
  long start;
  CVmNativeCodeDesc *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff85;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  uint uVar6;
  uint uVar7;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  utf8_ptr local_50;
  utf8_ptr local_48;
  ulong local_40;
  long local_38;
  long local_30;
  uint *local_28;
  long local_20;
  vm_val_t *local_18;
  vm_val_t *local_10;
  
  local_38 = 0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  utf8_ptr::utf8_ptr(&local_48);
  utf8_ptr::utf8_ptr(&local_50);
  if (local_28 == (uint *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = *local_28;
  }
  uVar7 = uVar6;
  if ((getp_substr(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_substr(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar2 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_substr::desc,1,1);
    __cxa_guard_release(&getp_substr(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffff8c,uVar7),
                     (uint *)CONCAT17(in_stack_ffffffffffffff87,
                                      CONCAT16(in_stack_ffffffffffffff86,
                                               CONCAT15(in_stack_ffffffffffffff85,
                                                        CONCAT14(in_stack_ffffffffffffff84,
                                                                 in_stack_ffffffffffffff80)))),
                     in_stack_ffffffffffffff78);
  if (iVar2 == 0) {
    iVar3 = CVmBif::pop_long_val();
    local_30 = (long)iVar3;
    if (1 < uVar6) {
      iVar3 = CVmBif::pop_long_val();
      local_38 = (long)iVar3;
    }
    CVmStack::push(local_18);
    utf8_ptr::set(&local_48,(char *)(local_20 + 2));
    local_40 = vmb_get_len((char *)0x339fd6);
    if (local_30 < 1) {
      if (local_30 < 0) {
        utf8_ptr::set(&local_48,(char *)(local_20 + 2 + local_40));
        local_40 = 0;
        while( true ) {
          bVar5 = false;
          if (local_30 < 0) {
            pcVar4 = utf8_ptr::getptr(&local_48);
            bVar5 = pcVar4 != (char *)(local_20 + 2);
          }
          if (!bVar5) break;
          utf8_ptr::dec((utf8_ptr *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        (size_t *)CONCAT44(in_stack_ffffffffffffff8c,uVar7));
          local_30 = local_30 + 1;
        }
        in_stack_ffffffffffffff86 = 0;
      }
    }
    else {
      for (; in_stack_ffffffffffffff87 = 1 < local_30 && local_40 != 0,
          1 < local_30 && local_40 != 0; local_30 = local_30 + -1) {
        utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      (size_t *)CONCAT44(in_stack_ffffffffffffff8c,uVar7));
      }
    }
    uVar1 = local_40;
    local_50.p_ = local_48.p_;
    if (1 < uVar6) {
      if (local_38 < 0) {
        pcVar4 = utf8_ptr::getptr(&local_48);
        utf8_ptr::set(&local_48,pcVar4 + local_40);
        local_40 = 0;
        for (; in_stack_ffffffffffffff84 = local_38 < 0 && local_40 < uVar1,
            local_38 < 0 && local_40 < uVar1; local_38 = local_38 + 1) {
          utf8_ptr::dec((utf8_ptr *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        (size_t *)CONCAT44(in_stack_ffffffffffffff8c,uVar7));
        }
      }
      else {
        for (; in_stack_ffffffffffffff85 = 0 < local_38 && local_40 != 0,
            0 < local_38 && local_40 != 0; local_38 = local_38 + -1) {
          utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        (size_t *)CONCAT44(in_stack_ffffffffffffff8c,uVar7));
        }
      }
    }
    utf8_ptr::getptr(&local_50);
    obj_00 = create(in_stack_ffffffffffffff94,(char *)CONCAT44(in_stack_ffffffffffffff8c,uVar7),
                    CONCAT17(in_stack_ffffffffffffff87,
                             CONCAT16(in_stack_ffffffffffffff86,
                                      CONCAT15(in_stack_ffffffffffffff85,
                                               CONCAT14(in_stack_ffffffffffffff84,
                                                        in_stack_ffffffffffffff80)))));
    vm_val_t::set_obj(local_10,obj_00);
    CVmStack::discard();
  }
  return 1;
}

Assistant:

int CVmObjString::getp_substr(VMG_ vm_val_t *retval, const vm_val_t *self_val,
                              const char *str, uint *in_argc)
{
    long start;
    long len = 0;
    size_t rem;
    utf8_ptr p;
    utf8_ptr start_p;
    size_t start_rem;
    size_t new_len;
    vm_obj_id_t obj;

    /* check arguments */
    uint argc = (in_argc == 0 ? 0 : *in_argc);
    static CVmNativeCodeDesc desc(1, 1);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* pop the starting index */
    start = CVmBif::pop_long_val(vmg0_);

    /* pop the length, if present */
    if (argc >= 2)
        len = CVmBif::pop_long_val(vmg0_);

    /* push a self-reference to protect against GC */
    G_stk->push(self_val);

    /* set up a utf8 pointer to traverse the string */
    p.set((char *)str + VMB_LEN);

    /* get the byte length of the string */
    rem = vmb_get_len(str);

    /* 
     *   Skip ahead to the starting index.  If the index is positive, it's
     *   an index from the start of the string; if it's negative, it's an
     *   offset from the end of the string.  
     */
    if (start > 0)
    {
        /* 
         *   it's an index from the start - skip ahead by start-1 characters
         *   (since a start value of 1 tells us to start at the first
         *   character) 
         */
        for ( ; start > 1 && rem != 0 ; --start)
            p.inc(&rem);
    }
    else if (start < 0)
    {
        /*
         *   It's an index from the end of the string: -1 tells us to start
         *   at the last character, -2 at the second to last, and so on.
         *   Move to the first byte past the end of the string, and work
         *   backwards by the given number of characters.  
         */
        for (p.set((char *)str + VMB_LEN + rem), rem = 0 ;
             start < 0 && p.getptr() != (char *)str + VMB_LEN ; ++start)
        {
            /* move back one character */
            p.dec(&rem);
        }
    }

    /* this is the starting position */
    start_p = p;
    start_rem = rem;

    /* 
     *   if a length was specified, calculate the number of bytes in the
     *   given length; otherwise, use the entire remainder of the string 
     */
    if (argc >= 2)
    {
        /* figure the positive or negative length */
        if (len >= 0)
        {
            /* 
             *   Positive length - this specifies the number of characters to
             *   keep starting at the starting index.  Skip ahead by the
             *   desired length to figure the end pointer. 
             */
            for ( ; len > 0 && rem != 0 ; --len)
                p.inc(&rem);
        }
        else
        {
            /*
             *   Negative length - this specifies the number of characters to
             *   remove from the end of the string.  Move to the end of the
             *   string, then skip back by |len| characters to find the end
             *   pointer.  
             */
            for (p.set(p.getptr() + rem), rem = 0 ;
                 len < 0 && rem < start_rem ; ++len)
                 p.dec(&rem);
        }

        /* use the difference in lengths from the starting point to here */
        new_len = start_rem - rem;
    }
    else
    {
        /* use the entire remainder of the string */
        new_len = start_rem;
    }

    /* create the new string */
    obj = CVmObjString::create(vmg_ FALSE, start_p.getptr(), new_len);

    /* return the new object */
    retval->set_obj(obj);

    /* discard the GC protection references */
    G_stk->discard();

    /* handled */
    return TRUE;
}